

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlElementContentPtr
xmlParseElementChildrenContentDeclPriv(xmlParserCtxtPtr ctxt,int inputchk,int depth)

{
  xmlChar xVar1;
  xmlElementContentType xVar2;
  _xmlElementContent *p_Var3;
  _xmlElementContent *p_Var4;
  xmlElementContentPtr cur;
  xmlChar *pxVar5;
  xmlParserInputPtr pxVar6;
  int iVar7;
  long lVar8;
  byte bVar9;
  xmlDocPtr doc;
  byte bVar10;
  byte bVar11;
  xmlElementContentPtr pxVar12;
  bool bVar13;
  undefined8 in_stack_ffffffffffffffb8;
  _xmlElementContent *local_40;
  
  iVar7 = 0x800;
  if ((ctxt->options & 0x80000) == 0) {
    iVar7 = 0x100;
  }
  if (iVar7 < depth) {
    xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_RESOURCE_LIMIT,XML_ERR_FATAL,
               (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,depth,
               "xmlParseElementChildrenContentDecl : depth %d too deep, use XML_PARSE_HUGE\n",
               CONCAT44((int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),depth));
    return (xmlElementContentPtr)0x0;
  }
  xmlSkipBlankCharsPE(ctxt);
  pxVar6 = ctxt->input;
  if (((pxVar6->flags & 0x40) == 0) && ((long)pxVar6->end - (long)pxVar6->cur < 0xfa)) {
    xmlParserGrow(ctxt);
  }
  if (*ctxt->input->cur == '(') {
    iVar7 = ctxt->input->id;
    xmlNextChar(ctxt);
    xmlSkipBlankCharsPE(ctxt);
    p_Var4 = xmlParseElementChildrenContentDeclPriv(ctxt,iVar7,depth + 1);
    if (p_Var4 == (xmlElementContentPtr)0x0) {
      return (xmlElementContentPtr)0x0;
    }
    xmlSkipBlankCharsPE(ctxt);
    pxVar6 = ctxt->input;
    if ((pxVar6->flags & 0x40) != 0) goto LAB_001390ab;
    lVar8 = (long)pxVar6->end - (long)pxVar6->cur;
  }
  else {
    pxVar5 = xmlParseName(ctxt);
    if (pxVar5 == (xmlChar *)0x0) {
      xmlFatalErr(ctxt,XML_ERR_ELEMCONTENT_NOT_STARTED,(char *)0x0);
      return (xmlElementContentPtr)0x0;
    }
    p_Var4 = xmlNewDocElementContent(ctxt->myDoc,pxVar5,XML_ELEMENT_CONTENT_ELEMENT);
    if (p_Var4 == (xmlElementContentPtr)0x0) {
      xmlCtxtErrMemory(ctxt);
      return (xmlElementContentPtr)0x0;
    }
    pxVar6 = ctxt->input;
    if (((pxVar6->flags & 0x40) == 0) && ((long)pxVar6->end - (long)pxVar6->cur < 0xfa)) {
      xmlParserGrow(ctxt);
    }
    xVar1 = *ctxt->input->cur;
    if (xVar1 == '*') {
      p_Var4->ocur = XML_ELEMENT_CONTENT_MULT;
LAB_00139076:
      xmlNextChar(ctxt);
    }
    else {
      if (xVar1 == '+') {
        p_Var4->ocur = XML_ELEMENT_CONTENT_PLUS;
        goto LAB_00139076;
      }
      if (xVar1 == '?') {
        p_Var4->ocur = XML_ELEMENT_CONTENT_OPT;
        goto LAB_00139076;
      }
      p_Var4->ocur = XML_ELEMENT_CONTENT_ONCE;
    }
    pxVar6 = ctxt->input;
    if ((pxVar6->flags & 0x40) != 0) goto LAB_001390ab;
    lVar8 = (long)pxVar6->end - (long)pxVar6->cur;
  }
  if (lVar8 < 0xfa) {
    xmlParserGrow(ctxt);
  }
LAB_001390ab:
  xmlSkipBlankCharsPE(ctxt);
  pxVar6 = ctxt->input;
  bVar10 = *pxVar6->cur;
  local_40 = p_Var4;
  if ((bVar10 == 0x29) || (1 < ctxt->disableSAX)) {
    cur = (_xmlElementContent *)0x0;
  }
  else {
    cur = (xmlElementContentPtr)0x0;
    pxVar12 = p_Var4;
    bVar9 = 0;
    do {
      bVar11 = bVar10;
      if (bVar10 != 0x7c) {
        if (bVar10 != 0x2c) {
          xmlFatalErr(ctxt,XML_ERR_ELEMCONTENT_NOT_FINISHED,(char *)0x0);
          goto LAB_00139518;
        }
        if ((bVar9 != 0) && (bVar11 = bVar9, bVar9 != 0x2c)) goto LAB_001394af;
        xmlNextChar(ctxt);
        p_Var4 = xmlNewDocElementContent(ctxt->myDoc,(xmlChar *)0x0,XML_ELEMENT_CONTENT_SEQ);
        if (p_Var4 != (xmlElementContentPtr)0x0) goto LAB_00139167;
        xmlCtxtErrMemory(ctxt);
        if ((cur != (xmlElementContentPtr)0x0) && (cur != local_40)) {
          xmlFreeDocElementContent(ctxt->myDoc,cur);
        }
LAB_00139538:
        doc = ctxt->myDoc;
LAB_00139575:
        xmlFreeDocElementContent(doc,local_40);
        return (xmlElementContentPtr)0x0;
      }
      if ((bVar9 != 0) && (bVar11 = bVar9, bVar9 != 0x7c)) {
LAB_001394af:
        xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_SEPARATOR_REQUIRED,XML_ERR_FATAL,
                   (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,(uint)bVar9,
                   "xmlParseElementChildrenContentDecl : \'%c\' expected\n",
                   CONCAT44((int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),(uint)bVar9));
LAB_00139518:
        if ((cur != (xmlElementContentPtr)0x0) && (cur != local_40)) {
          xmlFreeDocElementContent(ctxt->myDoc,cur);
        }
        if (local_40 == (_xmlElementContent *)0x0) {
          return (xmlElementContentPtr)0x0;
        }
        goto LAB_00139538;
      }
      xmlNextChar(ctxt);
      p_Var4 = xmlNewDocElementContent(ctxt->myDoc,(xmlChar *)0x0,XML_ELEMENT_CONTENT_OR);
      if (p_Var4 == (xmlElementContentPtr)0x0) {
        xmlCtxtErrMemory(ctxt);
        goto LAB_00139518;
      }
LAB_00139167:
      if (cur == (xmlElementContentPtr)0x0) {
        p_Var4->c1 = local_40;
        bVar13 = local_40 != (_xmlElementContent *)0x0;
        cur = local_40;
        local_40 = p_Var4;
        if (bVar13) goto LAB_00139196;
      }
      else {
        pxVar12->c2 = p_Var4;
        p_Var4->parent = pxVar12;
        p_Var4->c1 = cur;
LAB_00139196:
        cur->parent = p_Var4;
      }
      pxVar6 = ctxt->input;
      if (((pxVar6->flags & 0x40) == 0) && ((long)pxVar6->end - (long)pxVar6->cur < 0xfa)) {
        xmlParserGrow(ctxt);
      }
      xmlSkipBlankCharsPE(ctxt);
      pxVar6 = ctxt->input;
      if (((pxVar6->flags & 0x40) == 0) && ((long)pxVar6->end - (long)pxVar6->cur < 0xfa)) {
        xmlParserGrow(ctxt);
      }
      if (*ctxt->input->cur != '(') {
        pxVar5 = xmlParseName(ctxt);
        if (pxVar5 == (xmlChar *)0x0) {
          xmlFatalErr(ctxt,XML_ERR_ELEMCONTENT_NOT_STARTED,(char *)0x0);
          if (local_40 == (xmlElementContentPtr)0x0) {
            return (xmlElementContentPtr)0x0;
          }
        }
        else {
          cur = xmlNewDocElementContent(ctxt->myDoc,pxVar5,XML_ELEMENT_CONTENT_ELEMENT);
          if (cur != (xmlElementContentPtr)0x0) {
            xVar1 = *ctxt->input->cur;
            if (xVar1 == '*') {
              cur->ocur = XML_ELEMENT_CONTENT_MULT;
            }
            else if (xVar1 == '+') {
              cur->ocur = XML_ELEMENT_CONTENT_PLUS;
            }
            else {
              if (xVar1 != '?') {
                cur->ocur = XML_ELEMENT_CONTENT_ONCE;
                goto LAB_001392c5;
              }
              cur->ocur = XML_ELEMENT_CONTENT_OPT;
            }
            xmlNextChar(ctxt);
            goto LAB_001392c5;
          }
          xmlCtxtErrMemory(ctxt);
          if (local_40 == (xmlElementContentPtr)0x0) {
            return (xmlElementContentPtr)0x0;
          }
        }
        doc = ctxt->myDoc;
        goto LAB_00139575;
      }
      iVar7 = ctxt->input->id;
      xmlNextChar(ctxt);
      xmlSkipBlankCharsPE(ctxt);
      cur = xmlParseElementChildrenContentDeclPriv(ctxt,iVar7,depth + 1);
      if (cur == (xmlElementContentPtr)0x0) {
        if (local_40 != (xmlElementContentPtr)0x0) {
          xmlFreeDocElementContent(ctxt->myDoc,local_40);
        }
      }
      else {
        xmlSkipBlankCharsPE(ctxt);
      }
      if (cur == (xmlElementContentPtr)0x0) {
        return (xmlElementContentPtr)0x0;
      }
LAB_001392c5:
      xmlSkipBlankCharsPE(ctxt);
      pxVar6 = ctxt->input;
      if (((pxVar6->flags & 0x40) == 0) && ((long)pxVar6->end - (long)pxVar6->cur < 0xfa)) {
        xmlParserGrow(ctxt);
      }
      pxVar6 = ctxt->input;
      bVar10 = *pxVar6->cur;
    } while ((bVar10 != 0x29) && (pxVar12 = p_Var4, bVar9 = bVar11, ctxt->disableSAX < 2));
  }
  if (cur != (_xmlElementContent *)0x0) {
    p_Var4->c2 = cur;
    cur->parent = p_Var4;
  }
  if (pxVar6->id != inputchk) {
    xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_ENTITY_BOUNDARY,XML_ERR_FATAL,
               (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
               "Element content declaration doesn\'t start and stop in the same entity\n");
  }
  xmlNextChar(ctxt);
  xVar1 = *ctxt->input->cur;
  if (xVar1 == '*') {
    if (local_40 != (xmlElementContentPtr)0x0) {
      local_40->ocur = XML_ELEMENT_CONTENT_MULT;
      xVar2 = local_40->type;
      p_Var4 = local_40;
      while (xVar2 == XML_ELEMENT_CONTENT_OR) {
        p_Var3 = p_Var4->c1;
        if ((p_Var3 != (_xmlElementContent *)0x0) &&
           ((p_Var3->ocur & ~XML_ELEMENT_CONTENT_ONCE) == XML_ELEMENT_CONTENT_OPT)) {
          p_Var3->ocur = XML_ELEMENT_CONTENT_ONCE;
        }
        p_Var4 = p_Var4->c2;
        if (p_Var4 == (_xmlElementContent *)0x0) break;
        if ((p_Var4->ocur & ~XML_ELEMENT_CONTENT_ONCE) == XML_ELEMENT_CONTENT_OPT) {
          p_Var4->ocur = XML_ELEMENT_CONTENT_ONCE;
        }
        xVar2 = p_Var4->type;
      }
    }
  }
  else if (xVar1 == '+') {
    if (local_40 != (xmlElementContentPtr)0x0) {
      local_40->ocur =
           ((local_40->ocur & ~XML_ELEMENT_CONTENT_ONCE) != XML_ELEMENT_CONTENT_OPT) +
           XML_ELEMENT_CONTENT_MULT;
      bVar13 = false;
      do {
        if (p_Var4->type != XML_ELEMENT_CONTENT_OR) break;
        p_Var3 = p_Var4->c1;
        if ((p_Var3 != (_xmlElementContent *)0x0) &&
           ((p_Var3->ocur & ~XML_ELEMENT_CONTENT_ONCE) == XML_ELEMENT_CONTENT_OPT)) {
          p_Var3->ocur = XML_ELEMENT_CONTENT_ONCE;
          bVar13 = true;
        }
        p_Var4 = p_Var4->c2;
        if ((p_Var4 != (_xmlElementContent *)0x0) &&
           ((p_Var4->ocur & ~XML_ELEMENT_CONTENT_ONCE) == XML_ELEMENT_CONTENT_OPT)) {
          p_Var4->ocur = XML_ELEMENT_CONTENT_ONCE;
          bVar13 = true;
        }
      } while (p_Var4 != (_xmlElementContent *)0x0);
      if (bVar13) {
        local_40->ocur = XML_ELEMENT_CONTENT_MULT;
      }
    }
  }
  else {
    if (xVar1 != '?') {
      return local_40;
    }
    if (local_40 != (xmlElementContentPtr)0x0) {
      local_40->ocur = (local_40->ocur - XML_ELEMENT_CONTENT_MULT < 2) + XML_ELEMENT_CONTENT_OPT;
    }
  }
  xmlNextChar(ctxt);
  return local_40;
}

Assistant:

static xmlElementContentPtr
xmlParseElementChildrenContentDeclPriv(xmlParserCtxtPtr ctxt, int inputchk,
                                       int depth) {
    int maxDepth = (ctxt->options & XML_PARSE_HUGE) ? 2048 : 256;
    xmlElementContentPtr ret = NULL, cur = NULL, last = NULL, op = NULL;
    const xmlChar *elem;
    xmlChar type = 0;

    if (depth > maxDepth) {
        xmlFatalErrMsgInt(ctxt, XML_ERR_RESOURCE_LIMIT,
                "xmlParseElementChildrenContentDecl : depth %d too deep, "
                "use XML_PARSE_HUGE\n", depth);
	return(NULL);
    }
    SKIP_BLANKS_PE;
    GROW;
    if (RAW == '(') {
	int inputid = ctxt->input->id;

        /* Recurse on first child */
	NEXT;
	SKIP_BLANKS_PE;
        cur = ret = xmlParseElementChildrenContentDeclPriv(ctxt, inputid,
                                                           depth + 1);
        if (cur == NULL)
            return(NULL);
	SKIP_BLANKS_PE;
	GROW;
    } else {
	elem = xmlParseName(ctxt);
	if (elem == NULL) {
	    xmlFatalErr(ctxt, XML_ERR_ELEMCONTENT_NOT_STARTED, NULL);
	    return(NULL);
	}
        cur = ret = xmlNewDocElementContent(ctxt->myDoc, elem, XML_ELEMENT_CONTENT_ELEMENT);
	if (cur == NULL) {
	    xmlErrMemory(ctxt);
	    return(NULL);
	}
	GROW;
	if (RAW == '?') {
	    cur->ocur = XML_ELEMENT_CONTENT_OPT;
	    NEXT;
	} else if (RAW == '*') {
	    cur->ocur = XML_ELEMENT_CONTENT_MULT;
	    NEXT;
	} else if (RAW == '+') {
	    cur->ocur = XML_ELEMENT_CONTENT_PLUS;
	    NEXT;
	} else {
	    cur->ocur = XML_ELEMENT_CONTENT_ONCE;
	}
	GROW;
    }
    SKIP_BLANKS_PE;
    while ((RAW != ')') && (PARSER_STOPPED(ctxt) == 0)) {
        /*
	 * Each loop we parse one separator and one element.
	 */
        if (RAW == ',') {
	    if (type == 0) type = CUR;

	    /*
	     * Detect "Name | Name , Name" error
	     */
	    else if (type != CUR) {
		xmlFatalErrMsgInt(ctxt, XML_ERR_SEPARATOR_REQUIRED,
		    "xmlParseElementChildrenContentDecl : '%c' expected\n",
		                  type);
		if ((last != NULL) && (last != ret))
		    xmlFreeDocElementContent(ctxt->myDoc, last);
		if (ret != NULL)
		    xmlFreeDocElementContent(ctxt->myDoc, ret);
		return(NULL);
	    }
	    NEXT;

	    op = xmlNewDocElementContent(ctxt->myDoc, NULL, XML_ELEMENT_CONTENT_SEQ);
	    if (op == NULL) {
                xmlErrMemory(ctxt);
		if ((last != NULL) && (last != ret))
		    xmlFreeDocElementContent(ctxt->myDoc, last);
	        xmlFreeDocElementContent(ctxt->myDoc, ret);
		return(NULL);
	    }
	    if (last == NULL) {
		op->c1 = ret;
		if (ret != NULL)
		    ret->parent = op;
		ret = cur = op;
	    } else {
	        cur->c2 = op;
		if (op != NULL)
		    op->parent = cur;
		op->c1 = last;
		if (last != NULL)
		    last->parent = op;
		cur =op;
		last = NULL;
	    }
	} else if (RAW == '|') {
	    if (type == 0) type = CUR;

	    /*
	     * Detect "Name , Name | Name" error
	     */
	    else if (type != CUR) {
		xmlFatalErrMsgInt(ctxt, XML_ERR_SEPARATOR_REQUIRED,
		    "xmlParseElementChildrenContentDecl : '%c' expected\n",
				  type);
		if ((last != NULL) && (last != ret))
		    xmlFreeDocElementContent(ctxt->myDoc, last);
		if (ret != NULL)
		    xmlFreeDocElementContent(ctxt->myDoc, ret);
		return(NULL);
	    }
	    NEXT;

	    op = xmlNewDocElementContent(ctxt->myDoc, NULL, XML_ELEMENT_CONTENT_OR);
	    if (op == NULL) {
                xmlErrMemory(ctxt);
		if ((last != NULL) && (last != ret))
		    xmlFreeDocElementContent(ctxt->myDoc, last);
		if (ret != NULL)
		    xmlFreeDocElementContent(ctxt->myDoc, ret);
		return(NULL);
	    }
	    if (last == NULL) {
		op->c1 = ret;
		if (ret != NULL)
		    ret->parent = op;
		ret = cur = op;
	    } else {
	        cur->c2 = op;
		if (op != NULL)
		    op->parent = cur;
		op->c1 = last;
		if (last != NULL)
		    last->parent = op;
		cur =op;
		last = NULL;
	    }
	} else {
	    xmlFatalErr(ctxt, XML_ERR_ELEMCONTENT_NOT_FINISHED, NULL);
	    if ((last != NULL) && (last != ret))
	        xmlFreeDocElementContent(ctxt->myDoc, last);
	    if (ret != NULL)
		xmlFreeDocElementContent(ctxt->myDoc, ret);
	    return(NULL);
	}
	GROW;
	SKIP_BLANKS_PE;
	GROW;
	if (RAW == '(') {
	    int inputid = ctxt->input->id;
	    /* Recurse on second child */
	    NEXT;
	    SKIP_BLANKS_PE;
	    last = xmlParseElementChildrenContentDeclPriv(ctxt, inputid,
                                                          depth + 1);
            if (last == NULL) {
		if (ret != NULL)
		    xmlFreeDocElementContent(ctxt->myDoc, ret);
		return(NULL);
            }
	    SKIP_BLANKS_PE;
	} else {
	    elem = xmlParseName(ctxt);
	    if (elem == NULL) {
		xmlFatalErr(ctxt, XML_ERR_ELEMCONTENT_NOT_STARTED, NULL);
		if (ret != NULL)
		    xmlFreeDocElementContent(ctxt->myDoc, ret);
		return(NULL);
	    }
	    last = xmlNewDocElementContent(ctxt->myDoc, elem, XML_ELEMENT_CONTENT_ELEMENT);
	    if (last == NULL) {
                xmlErrMemory(ctxt);
		if (ret != NULL)
		    xmlFreeDocElementContent(ctxt->myDoc, ret);
		return(NULL);
	    }
	    if (RAW == '?') {
		last->ocur = XML_ELEMENT_CONTENT_OPT;
		NEXT;
	    } else if (RAW == '*') {
		last->ocur = XML_ELEMENT_CONTENT_MULT;
		NEXT;
	    } else if (RAW == '+') {
		last->ocur = XML_ELEMENT_CONTENT_PLUS;
		NEXT;
	    } else {
		last->ocur = XML_ELEMENT_CONTENT_ONCE;
	    }
	}
	SKIP_BLANKS_PE;
	GROW;
    }
    if ((cur != NULL) && (last != NULL)) {
        cur->c2 = last;
	if (last != NULL)
	    last->parent = cur;
    }
    if (ctxt->input->id != inputchk) {
	xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                       "Element content declaration doesn't start and stop in"
                       " the same entity\n");
    }
    NEXT;
    if (RAW == '?') {
	if (ret != NULL) {
	    if ((ret->ocur == XML_ELEMENT_CONTENT_PLUS) ||
	        (ret->ocur == XML_ELEMENT_CONTENT_MULT))
	        ret->ocur = XML_ELEMENT_CONTENT_MULT;
	    else
	        ret->ocur = XML_ELEMENT_CONTENT_OPT;
	}
	NEXT;
    } else if (RAW == '*') {
	if (ret != NULL) {
	    ret->ocur = XML_ELEMENT_CONTENT_MULT;
	    cur = ret;
	    /*
	     * Some normalization:
	     * (a | b* | c?)* == (a | b | c)*
	     */
	    while ((cur != NULL) && (cur->type == XML_ELEMENT_CONTENT_OR)) {
		if ((cur->c1 != NULL) &&
	            ((cur->c1->ocur == XML_ELEMENT_CONTENT_OPT) ||
		     (cur->c1->ocur == XML_ELEMENT_CONTENT_MULT)))
		    cur->c1->ocur = XML_ELEMENT_CONTENT_ONCE;
		if ((cur->c2 != NULL) &&
	            ((cur->c2->ocur == XML_ELEMENT_CONTENT_OPT) ||
		     (cur->c2->ocur == XML_ELEMENT_CONTENT_MULT)))
		    cur->c2->ocur = XML_ELEMENT_CONTENT_ONCE;
		cur = cur->c2;
	    }
	}
	NEXT;
    } else if (RAW == '+') {
	if (ret != NULL) {
	    int found = 0;

	    if ((ret->ocur == XML_ELEMENT_CONTENT_OPT) ||
	        (ret->ocur == XML_ELEMENT_CONTENT_MULT))
	        ret->ocur = XML_ELEMENT_CONTENT_MULT;
	    else
	        ret->ocur = XML_ELEMENT_CONTENT_PLUS;
	    /*
	     * Some normalization:
	     * (a | b*)+ == (a | b)*
	     * (a | b?)+ == (a | b)*
	     */
	    while ((cur != NULL) && (cur->type == XML_ELEMENT_CONTENT_OR)) {
		if ((cur->c1 != NULL) &&
	            ((cur->c1->ocur == XML_ELEMENT_CONTENT_OPT) ||
		     (cur->c1->ocur == XML_ELEMENT_CONTENT_MULT))) {
		    cur->c1->ocur = XML_ELEMENT_CONTENT_ONCE;
		    found = 1;
		}
		if ((cur->c2 != NULL) &&
	            ((cur->c2->ocur == XML_ELEMENT_CONTENT_OPT) ||
		     (cur->c2->ocur == XML_ELEMENT_CONTENT_MULT))) {
		    cur->c2->ocur = XML_ELEMENT_CONTENT_ONCE;
		    found = 1;
		}
		cur = cur->c2;
	    }
	    if (found)
		ret->ocur = XML_ELEMENT_CONTENT_MULT;
	}
	NEXT;
    }
    return(ret);
}